

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O2

void duckdb::MatchAndReplace<duckdb::StrpTimeFormat>
               (CSVOption<duckdb::StrpTimeFormat> *original,
               CSVOption<duckdb::StrpTimeFormat> *sniffed,string *name,string *error)

{
  bool bVar1;
  string *__rhs;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  StrTimeFormat local_a0;
  
  if (original->set_by_user == true) {
    __lhs = &(original->value).super_StrTimeFormat.format_specifier;
    __rhs = &(sniffed->value).super_StrTimeFormat.format_specifier;
    bVar1 = ::std::operator!=(__lhs,__rhs);
    if (bVar1) {
      ::std::operator+(&local_160,
                       "CSV Sniffer: Sniffer detected value different than the user input for the ",
                       name);
      ::std::__cxx11::string::append((string *)error);
      ::std::__cxx11::string::~string((string *)&local_160);
      ::std::__cxx11::string::string((string *)&local_c0,(string *)__lhs);
      ::std::operator+(&local_120," options \n Set: ",&local_c0);
      ::std::operator+(&local_100,&local_120,", Sniffed: ");
      ::std::__cxx11::string::string((string *)&local_140,(string *)__rhs);
      ::std::operator+(&local_e0,&local_100,&local_140);
      ::std::operator+(&local_160,&local_e0,anon_var_dwarf_3b2a754 + 8);
      ::std::__cxx11::string::append((string *)error);
      ::std::__cxx11::string::~string((string *)&local_160);
      ::std::__cxx11::string::~string((string *)&local_e0);
      ::std::__cxx11::string::~string((string *)&local_140);
      ::std::__cxx11::string::~string((string *)&local_100);
      ::std::__cxx11::string::~string((string *)&local_120);
      ::std::__cxx11::string::~string((string *)&local_c0);
    }
  }
  else {
    StrpTimeFormat::StrpTimeFormat((StrpTimeFormat *)&local_a0,&sniffed->value);
    CSVOption<duckdb::StrpTimeFormat>::Set(original,(StrpTimeFormat *)&local_a0,false);
    StrTimeFormat::~StrTimeFormat(&local_a0);
  }
  return;
}

Assistant:

void MatchAndReplace(CSVOption<T> &original, CSVOption<T> &sniffed, const string &name, string &error) {
	if (original.IsSetByUser()) {
		// We verify that the user input matches the sniffed value
		if (original != sniffed) {
			error += "CSV Sniffer: Sniffer detected value different than the user input for the " + name;
			error += " options \n Set: " + original.FormatValue() + ", Sniffed: " + sniffed.FormatValue() + "\n";
		}
	} else {
		// We replace the value of original with the sniffed value
		original.Set(sniffed.GetValue(), false);
	}
}